

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bm_utils.c
# Opt level: O2

char ** mk_ascdate(void)

{
  char **ppcVar1;
  char *__dest;
  undefined8 uVar2;
  long index;
  dss_time_t t;
  
  ppcVar1 = (char **)malloc(0x4fe8);
  if (ppcVar1 == (char **)0x0) {
    uVar2 = 0x21b;
  }
  else {
    index = 1;
    while( true ) {
      if (index == 0x9fe) {
        return ppcVar1;
      }
      __dest = (char *)malloc(0xd);
      ppcVar1[index + -1] = __dest;
      if (__dest == (char *)0x0) break;
      mk_time(index,&t);
      strcpy(__dest,t.alpha);
      index = index + 1;
    }
    uVar2 = 0x21f;
  }
  fprintf(_stderr,"Malloc failed at %s:%d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/eyalroz[P]ssb-dbgen/src/bm_utils.c",
          uVar2);
  exit(1);
}

Assistant:

char **
mk_ascdate(void)
{
    char **m;
    dss_time_t t;
    int i;

    m = (char**) malloc((size_t)(TOTDATE * sizeof (char *)));
    MALLOC_CHECK(m);
    for (i = 0; i < TOTDATE; i++)
        {
        m[i] = (char *)malloc(DATE_LEN * sizeof(char));
        MALLOC_CHECK(m[i]);
        mk_time((long)(i + 1), &t);
        strcpy(m[i], t.alpha);
        }

    return(m);
}